

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlFreeNode(xmlNodePtr cur)

{
  int iVar1;
  xmlDeregisterNodeFunc *pp_Var2;
  xmlDictPtr local_18;
  xmlDictPtr dict;
  xmlNodePtr cur_local;
  
  local_18 = (xmlDictPtr)0x0;
  if (cur != (xmlNodePtr)0x0) {
    if (cur->type == XML_DTD_NODE) {
      xmlFreeDtd((xmlDtdPtr)cur);
    }
    else if (cur->type == XML_NAMESPACE_DECL) {
      xmlFreeNs((xmlNsPtr)cur);
    }
    else if (cur->type == XML_ATTRIBUTE_NODE) {
      xmlFreeProp((xmlAttrPtr)cur);
    }
    else if (cur->type == XML_ENTITY_DECL) {
      xmlFreeEntity((xmlEntityPtr)cur);
    }
    else {
      if ((xmlRegisterCallbacks != 0) &&
         (pp_Var2 = __xmlDeregisterNodeDefaultValue(), *pp_Var2 != (xmlDeregisterNodeFunc)0x0)) {
        pp_Var2 = __xmlDeregisterNodeDefaultValue();
        (**pp_Var2)(cur);
      }
      if (cur->doc != (_xmlDoc *)0x0) {
        local_18 = cur->doc->dict;
      }
      if ((cur->children != (_xmlNode *)0x0) && (cur->type != XML_ENTITY_REF_NODE)) {
        xmlFreeNodeList(cur->children);
      }
      if (((cur->type == XML_ELEMENT_NODE) || (cur->type == XML_XINCLUDE_START)) ||
         (cur->type == XML_XINCLUDE_END)) {
        if (cur->properties != (_xmlAttr *)0x0) {
          xmlFreePropList(cur->properties);
        }
        if (cur->nsDef != (xmlNs *)0x0) {
          xmlFreeNsList(cur->nsDef);
        }
      }
      else if ((((cur->content != (xmlChar *)0x0) && (cur->type != XML_ENTITY_REF_NODE)) &&
               (((_xmlAttr **)cur->content != &cur->properties && (cur->content != (xmlChar *)0x0)))
               ) && ((local_18 == (xmlDictPtr)0x0 ||
                     (iVar1 = xmlDictOwns(local_18,cur->content), iVar1 == 0)))) {
        (*xmlFree)(cur->content);
      }
      if (((((cur->name != (xmlChar *)0x0) && (cur->type != XML_TEXT_NODE)) &&
           (cur->type != XML_COMMENT_NODE)) && (cur->name != (xmlChar *)0x0)) &&
         ((local_18 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(local_18,cur->name), iVar1 == 0)))) {
        (*xmlFree)(cur->name);
      }
      (*xmlFree)(cur);
    }
  }
  return;
}

Assistant:

void
xmlFreeNode(xmlNodePtr cur) {
    xmlDictPtr dict = NULL;

    if (cur == NULL) return;

    /* use xmlFreeDtd for DTD nodes */
    if (cur->type == XML_DTD_NODE) {
	xmlFreeDtd((xmlDtdPtr) cur);
	return;
    }
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNs((xmlNsPtr) cur);
        return;
    }
    if (cur->type == XML_ATTRIBUTE_NODE) {
	xmlFreeProp((xmlAttrPtr) cur);
	return;
    }
    if (cur->type == XML_ENTITY_DECL) {
        xmlFreeEntity((xmlEntityPtr) cur);
        return;
    }

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue(cur);

    if (cur->doc != NULL) dict = cur->doc->dict;

    if ((cur->children != NULL) &&
	(cur->type != XML_ENTITY_REF_NODE))
	xmlFreeNodeList(cur->children);

    if ((cur->type == XML_ELEMENT_NODE) ||
        (cur->type == XML_XINCLUDE_START) ||
        (cur->type == XML_XINCLUDE_END)) {
        if (cur->properties != NULL)
            xmlFreePropList(cur->properties);
        if (cur->nsDef != NULL)
            xmlFreeNsList(cur->nsDef);
    } else if ((cur->content != NULL) &&
               (cur->type != XML_ENTITY_REF_NODE) &&
               (cur->content != (xmlChar *) &(cur->properties))) {
        DICT_FREE(cur->content)
    }

    /*
     * When a node is a text node or a comment, it uses a global static
     * variable for the name of the node.
     * Otherwise the node name might come from the document's dictionary
     */
    if ((cur->name != NULL) &&
        (cur->type != XML_TEXT_NODE) &&
        (cur->type != XML_COMMENT_NODE))
	DICT_FREE(cur->name)

    xmlFree(cur);
}